

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

Value * __thiscall Json::Path::resolve(Path *this,Value *root)

{
  bool bVar1;
  Value *in_RSI;
  string *in_RDI;
  PathArgument *arg;
  const_iterator it;
  Value *node;
  Value *in_stack_00000038;
  Value *in_stack_ffffffffffffffd0;
  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
  local_20;
  Value *local_18;
  
  local_18 = in_RSI;
  local_20._M_current =
       (PathArgument *)
       std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::begin
                 ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)in_RDI);
  while( true ) {
    std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>::end
              ((vector<Json::PathArgument,_std::allocator<Json::PathArgument>_> *)in_RDI);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         (Value *)__gnu_cxx::
                  __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
                  ::operator*(&local_20);
    if (*(Kind *)((long)&in_stack_ffffffffffffffd0->limit_ + 4) == kindIndex) {
      bVar1 = Value::isArray(local_18);
      if (bVar1) {
        Value::isValidIndex(in_stack_ffffffffffffffd0,(ArrayIndex)((ulong)in_RDI >> 0x20));
      }
      local_18 = Value::operator[](in_stack_00000038,this._4_4_);
    }
    else if (*(Kind *)((long)&in_stack_ffffffffffffffd0->limit_ + 4) == kindKey) {
      Value::isObject(local_18);
      local_18 = Value::operator[](in_stack_ffffffffffffffd0,in_RDI);
    }
    __gnu_cxx::
    __normal_iterator<const_Json::PathArgument_*,_std::vector<Json::PathArgument,_std::allocator<Json::PathArgument>_>_>
    ::operator++(&local_20);
  }
  return local_18;
}

Assistant:

const Value& Path::resolve(const Value& root) const {
  const Value* node = &root;
  for (Args::const_iterator it = args_.begin(); it != args_.end(); ++it) {
    const PathArgument& arg = *it;
    if (arg.kind_ == PathArgument::kindIndex) {
      if (!node->isArray() || !node->isValidIndex(arg.index_)) {
        // Error: unable to resolve path (array value expected at position...
      }
      node = &((*node)[arg.index_]);
    } else if (arg.kind_ == PathArgument::kindKey) {
      if (!node->isObject()) {
        // Error: unable to resolve path (object value expected at position...)
      }
      node = &((*node)[arg.key_]);
      if (node == &Value::null) {
        // Error: unable to resolve path (object has no member named '' at
        // position...)
      }
    }
  }
  return *node;
}